

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hiredis.c
# Opt level: O1

int redisBufferWrite(redisContext *c,int *done)

{
  char *pcVar1;
  uint start;
  uint uVar2;
  ulong uVar3;
  sds pcVar4;
  int iVar5;
  
  iVar5 = -1;
  if (c->err == 0) {
    pcVar1 = c->obuf;
    switch(pcVar1[-1] & 7) {
    case 0:
      uVar3 = (ulong)((byte)pcVar1[-1] >> 3);
      break;
    case 1:
      uVar3 = (ulong)(byte)pcVar1[-3];
      break;
    case 2:
      uVar3 = (ulong)*(ushort *)(pcVar1 + -5);
      break;
    case 3:
      uVar3 = (ulong)*(uint *)(pcVar1 + -9);
      break;
    case 4:
      uVar3 = *(ulong *)(pcVar1 + -0x11);
      break;
    default:
      uVar3 = 0;
    }
    if (uVar3 != 0) {
      start = (*c->funcs->write)(c);
      if (0 < (int)start) {
        pcVar4 = c->obuf;
        switch(pcVar4[-1] & 7) {
        case 0:
          uVar2 = (uint)((byte)pcVar4[-1] >> 3);
          break;
        case 1:
          uVar2 = (uint)(byte)pcVar4[-3];
          break;
        case 2:
          uVar2 = (uint)*(ushort *)(pcVar4 + -5);
          break;
        case 3:
          uVar2 = *(uint *)(pcVar4 + -9);
          break;
        case 4:
          uVar2 = (uint)*(undefined8 *)(pcVar4 + -0x11);
          break;
        default:
          uVar2 = 0;
        }
        if (start == uVar2) {
          sdsfree(pcVar4);
          pcVar4 = sdsempty();
          c->obuf = pcVar4;
        }
        else {
          sdsrange(pcVar4,start,-1);
        }
      }
      if ((int)start < 0) {
        return -1;
      }
    }
    if (done == (int *)0x0) {
      iVar5 = 0;
    }
    else {
      pcVar1 = c->obuf;
      iVar5 = 0;
      switch(pcVar1[-1] & 7) {
      case 0:
        uVar3 = (ulong)((byte)pcVar1[-1] >> 3);
        break;
      case 1:
        uVar3 = (ulong)(byte)pcVar1[-3];
        break;
      case 2:
        uVar3 = (ulong)*(ushort *)(pcVar1 + -5);
        break;
      case 3:
        uVar3 = (ulong)*(uint *)(pcVar1 + -9);
        break;
      case 4:
        uVar3 = *(ulong *)(pcVar1 + -0x11);
        break;
      default:
        uVar3 = 0;
      }
      *done = (uint)(uVar3 == 0);
    }
  }
  return iVar5;
}

Assistant:

int redisBufferWrite(redisContext *c, int *done) {

    /* Return early when the context has seen an error. */
    if (c->err)
        return REDIS_ERR;

    if (sdslen(c->obuf) > 0) {
        int nwritten = c->funcs->write(c);
        if (nwritten < 0) {
            return REDIS_ERR;
        } else if (nwritten > 0) {
            if (nwritten == (signed)sdslen(c->obuf)) {
                sdsfree(c->obuf);
                c->obuf = sdsempty();
            } else {
                sdsrange(c->obuf,nwritten,-1);
            }
        }
    }
    if (done != NULL) *done = (sdslen(c->obuf) == 0);
    return REDIS_OK;
}